

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void EmitWords(int *words,bool isInstructionStart)

{
  byte local_11;
  int *piStack_10;
  bool isInstructionStart_local;
  int *words_local;
  
  local_11 = isInstructionStart;
  piStack_10 = words;
  while (*piStack_10 != -1) {
    EmitWord(*piStack_10,(bool)(local_11 & 1));
    local_11 = 0;
    piStack_10 = piStack_10 + 1;
  }
  return;
}

Assistant:

void EmitWords(const int* words, bool isInstructionStart) {
	while (BYTES_END_MARKER != *words) {
		EmitWord(*words++, isInstructionStart);
		isInstructionStart = false;		// only true for first word
	}
}